

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall embree::XMLWriter::store_parm(XMLWriter *this,char *name,Vec3fa *v)

{
  size_t sVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined1 *puVar4;
  
  if (this->ident != 0) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->ident);
  }
  puVar4 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,"<float3 name=\"",0xe);
  if (name == (char *)0x0) {
    std::ios::clear((int)puVar4 + (int)*(undefined8 *)(*(long *)puVar4 + -0x18));
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar4,"\">",2);
  poVar2 = std::ostream::_M_insert<double>((double)(v->field_0).m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)(v->field_0).m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)(v->field_0).m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</float3>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store_parm(const char* name, const Vec3fa& v) {
    tab(); xml << "<float3 name=\"" << name << "\">" << v.x << " " << v.y << " " << v.z << "</float3>" << std::endl;
  }